

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::ClassEscapePass0
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,Char *singleton,
          bool *previousSurrogatePart)

{
  StandardChars<unsigned_char> *pSVar1;
  EncodedChar *pEVar2;
  EncodedChar EVar3;
  bool bVar4;
  Char CVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ScriptConfiguration *this_00;
  bool local_61;
  Char c;
  EncodedChar *location;
  uint m;
  CharCount digits;
  uint n;
  EncodedChar ec;
  bool *previousSurrogatePart_local;
  Char *singleton_local;
  Parser<UTF8EncodingPolicyBase<false>,_true> *this_local;
  
  EVar3 = ECLookahead(this,0);
  if ((EVar3 == '\0') && (bVar4 = IsEOF(this), bVar4)) {
    Fail(this,-0x7ff5ec67);
    return false;
  }
  bVar4 = StandardChars<unsigned_char>::IsOctal(this->standardEncodedChars,EVar3);
  if (bVar4) {
    m = 0;
    location._4_4_ = 0;
    do {
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,0);
      uVar6 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar3);
      uVar7 = m * 8 + uVar6;
      if (0xff < uVar7) break;
      ECConsume(this,1);
      location._4_4_ = location._4_4_ + 1;
      local_61 = false;
      if (location._4_4_ < 3) {
        pSVar1 = this->standardEncodedChars;
        EVar3 = ECLookahead(this,0);
        local_61 = StandardChars<unsigned_char>::IsOctal(pSVar1,EVar3);
      }
      m = uVar7;
    } while (local_61 != false);
    CVar5 = Chars<char16_t>::UTC(m & 0xffff);
    *singleton = CVar5;
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    return true;
  }
  pEVar2 = this->tempLocationOfSurrogatePair;
  this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
  CVar5 = NextChar(this);
  switch(CVar5) {
  case L'D':
  case L'S':
  case L'W':
  case L'd':
  case L's':
  case L'w':
    this_local._7_1_ = false;
    break;
  default:
    *singleton = CVar5;
    this_local._7_1_ = true;
    break;
  case L'b':
    *singleton = L'\b';
    this_local._7_1_ = true;
    break;
  case L'c':
    pSVar1 = this->standardEncodedChars;
    EVar3 = ECLookahead(this,0);
    bVar4 = StandardChars<unsigned_char>::IsLetter(pSVar1,EVar3);
    if (!bVar4) {
      DeferredFailIfUnicode(this,-0x7ff5e9d6);
    }
    pSVar1 = this->standardEncodedChars;
    EVar3 = ECLookahead(this,0);
    bVar4 = StandardChars<unsigned_char>::IsWord(pSVar1,EVar3);
    if (bVar4) {
      EVar3 = ECLookahead(this,0);
      uVar6 = Chars<unsigned_char>::CTU(EVar3);
      CVar5 = Chars<char16_t>::UTC(uVar6 & 0x1f);
      *singleton = CVar5;
      ECConsume(this,1);
    }
    else {
      ECRevert(this,1);
      *singleton = L'\\';
    }
    this_local._7_1_ = true;
    break;
  case L'f':
    *singleton = L'\f';
    this_local._7_1_ = true;
    break;
  case L'n':
    *singleton = L'\n';
    this_local._7_1_ = true;
    break;
  case L'r':
    *singleton = L'\r';
    this_local._7_1_ = true;
    break;
  case L't':
    *singleton = L'\t';
    this_local._7_1_ = true;
    break;
  case L'u':
    this->tempLocationOfSurrogatePair = pEVar2;
    iVar9 = TryParseExtendedUnicodeEscape(this,singleton,previousSurrogatePart,true);
    if (0 < iVar9) {
      return true;
    }
    bVar4 = ECCanConsume(this,4);
    if (bVar4) {
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,0);
      bVar4 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar3);
      if (!bVar4) goto LAB_015b98d4;
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,1);
      bVar4 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar3);
      if (!bVar4) goto LAB_015b98d4;
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,2);
      bVar4 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar3);
      if (!bVar4) goto LAB_015b98d4;
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,3);
      bVar4 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar3);
      if (!bVar4) goto LAB_015b98d4;
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,0);
      uVar6 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar3);
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,1);
      uVar8 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar3);
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,2);
      uVar10 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar3);
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,3);
      uVar11 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar3);
      CVar5 = Chars<char16_t>::UTC(uVar6 << 0xc | uVar8 << 8 | uVar10 << 4 | uVar11);
      *singleton = CVar5;
      this_00 = Js::ScriptContext::GetConfig(this->scriptContext);
      bVar4 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_00);
      if (bVar4) {
        TrackIfSurrogatePair(this,(uint)(ushort)*singleton,this->next + -1,5);
      }
      ECConsume(this,4);
    }
    else {
LAB_015b98d4:
      *singleton = CVar5;
    }
    this_local._7_1_ = true;
    break;
  case L'v':
    *singleton = L'\v';
    this_local._7_1_ = true;
    break;
  case L'x':
    bVar4 = ECCanConsume(this,2);
    if (bVar4) {
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,0);
      bVar4 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar3);
      if (!bVar4) goto LAB_015b968e;
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,1);
      bVar4 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar3);
      if (!bVar4) goto LAB_015b968e;
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,0);
      uVar6 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar3);
      pSVar1 = this->standardEncodedChars;
      EVar3 = ECLookahead(this,1);
      uVar8 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar3);
      CVar5 = Chars<char16_t>::UTC(uVar6 << 4 | uVar8);
      *singleton = CVar5;
      ECConsume(this,2);
    }
    else {
LAB_015b968e:
      *singleton = CVar5;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser<P, IsLiteral>::ClassEscapePass0(Char& singleton, bool& previousSurrogatePart)
    {
        // Could be terminating 0
        EncodedChar ec = ECLookahead();
        if (ec == 0 && IsEOF())
        {
            Fail(JSERR_RegExpSyntax);
            return false;
        }
        else if (standardEncodedChars->IsOctal(ec))
        {
            uint n = 0;
            CharCount digits = 0;
            do
            {
                uint m = n * 8  + standardEncodedChars->DigitValue(ECLookahead());
                if (m > Chars<uint8>::MaxUChar) //Regex octal codes only support single byte (ASCII) characters.
                    break;
                n = m;
                ECConsume();
                digits++;
            }
            while (digits < 3 && standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not octal
            singleton = UTC((UChar)n);
            // Clear possible pair
            this->tempLocationOfSurrogatePair = nullptr;
            return true;
        }
        else
        {
            const EncodedChar* location = this->tempLocationOfSurrogatePair;
            // Clear it for now, otherwise to many branches to clear it on.
            this->tempLocationOfSurrogatePair = nullptr;
            // An escaped '/' is ok
            Char c = NextChar();
            switch (c)
            {
            case 'b':
                singleton = '\b';
                return true;
            case 'f':
                singleton = '\f';
                return true;
            case 'n':
                singleton = '\n';
                return true;
            case 'r':
                singleton = '\r';
                return true;
            case 't':
                singleton = '\t';
                return true;
            case 'v':
                singleton = '\v';
                return true;
            case 'd':
            case 'D':
            case 's':
            case 'S':
            case 'w':
            case 'W':
                return false;
            case 'c':
                if (!standardEncodedChars->IsLetter(ECLookahead())) //Letter set [A-Z, a-z]
                {
                    // Fail in unicode mode for non-letter escaped control characters according to 262 Annex-B RegExp grammar spec #prod-annexB-Term 
                    DeferredFailIfUnicode(JSERR_RegExpInvalidEscape);
                }

                if (standardEncodedChars->IsWord(ECLookahead())) // word set [A-Z,a-z,0-9,_], terminating 0 is not a word character
                {
                    singleton = UTC(Chars<EncodedChar>::CTU(ECLookahead()) % 32);
                    ECConsume();
                }
                else
                {
                    // If the lookahead is a non-alphanumeric and not an underscore ('_'), then treat '\' and 'c' separately.
                    //#sec-regular-expression-patterns-semantics 
                    ECRevert(1); //Put cursor back at 'c' and treat it as a non-escaped character.
                    singleton = '\\';
                }
                return true;
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                {
                    singleton = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(1))));
                    ECConsume(2);
                }
                else
                    singleton = c;
                return true;
            case 'u':
                this->tempLocationOfSurrogatePair = location;
                if (this->TryParseExtendedUnicodeEscape(singleton, previousSurrogatePart, true) > 0)
                    return true;
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    singleton = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(3))));
                    if (this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                    {
                        // Current location
                        TrackIfSurrogatePair(singleton, (next - 1), 5);
                    }
                    // The above if statement, if true, will clear tempLocationOfSurrogatePair if needs to.
                    ECConsume(4);
                }
                else
                    singleton = c;
                return true;
            default:
                // embedded 0 is ok
                singleton = c;
                return true;
            }
        }
    }